

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::ShaderAtomicAddCase::verify
          (ShaderAtomicAddCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  ostringstream *poVar1;
  ostringstream *this_00;
  deUint32 dVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  ulong extraout_RAX;
  bool bVar6;
  int iVar7;
  _Base_ptr p_Var8;
  long lVar9;
  _Rb_tree_header *p_Var10;
  _Base_ptr p_Var11;
  deUint32 dVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  _Rb_tree_header *p_Var18;
  int in_stack_00000008;
  long in_stack_00000010;
  set<int,_std::less<int>,_std::allocator<int>_> outValues;
  bool local_242;
  int local_240;
  uint local_23c;
  ShaderAtomicAddCase *local_238;
  int local_22c;
  ulong local_228;
  int local_21c;
  int local_218;
  int local_214;
  ulong local_210;
  size_t local_208;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_200;
  ulong local_1d0;
  long local_1c8;
  size_t local_1c0;
  ulong local_1b8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  local_1c0 = tbslen;
  local_214 = (int)tbs;
  lVar9 = 0;
  uVar14 = (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[0];
  do {
    uVar13 = uVar14;
    uVar4 = (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[lVar9 + 1];
    uVar14 = uVar4 * uVar13;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 2);
  uVar17 = (long)((ulong)(uint)((int)ctx >> 0x1f) << 0x20 | (ulong)ctx & 0xffffffff) /
           (long)(int)uVar14;
  local_1d0 = uVar17 & 0xffffffff;
  local_242 = (int)uVar17 < 1;
  if (0 < (int)uVar17) {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1c8 = (long)(int)uVar14;
    local_1d0 = uVar17 & 0xffffffff;
    local_210 = (ulong)uVar14;
    local_22c = (int)sig;
    local_21c = uVar13 * local_22c * uVar4;
    local_218 = 0;
    uVar17 = 0;
    local_238 = this;
    local_208 = siglen;
    do {
      iVar15 = (int)uVar17;
      dVar2 = *(deUint32 *)(in_stack_00000010 + iVar15 * in_stack_00000008);
      local_200._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_200._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_200._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_200._M_impl.super__Rb_tree_header._M_header;
      local_200._M_impl.super__Rb_tree_header._M_node_count = 0;
      dVar12 = (this->super_ShaderAtomicOpCase).m_initialValue;
      uVar5 = local_210;
      iVar7 = local_218;
      if (0 < (int)uVar14) {
        do {
          dVar12 = dVar12 + *(int *)(local_208 + (long)iVar7);
          iVar7 = iVar7 + local_22c;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
      local_200._M_impl.super__Rb_tree_header._M_header._M_right =
           local_200._M_impl.super__Rb_tree_header._M_header._M_left;
      if (dVar2 != dVar12) {
        local_1b0._0_8_ =
             ((local_238->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"ERROR: at group ",0x10);
        std::ostream::operator<<(poVar1,iVar15);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,": expected sum ",0xf);
        std::ostream::operator<<(poVar1,dVar12);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", got ",6);
        std::ostream::operator<<(poVar1,dVar2);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_0149945c;
      }
      local_228 = uVar17;
      bVar6 = 0 < (int)uVar14;
      if ((int)uVar14 < 1) {
        uVar4 = 0;
      }
      else {
        local_1b8 = (ulong)(uVar14 * iVar15);
        uVar17 = 0;
        local_23c = 0;
        do {
          p_Var18 = &local_200._M_impl.super__Rb_tree_header;
          iVar16 = (int)uVar17;
          iVar7 = (int)local_1b8 + iVar16;
          iVar15 = dVar12 - *(int *)(local_208 + (long)(iVar7 * local_22c));
          local_240 = *(int *)(local_1c0 + (long)(iVar7 * local_214));
          if ((iVar15 < local_240) ||
             (p_Var8 = &p_Var18->_M_header,
             p_Var11 = local_200._M_impl.super__Rb_tree_header._M_header._M_parent,
             local_240 < (int)(local_238->super_ShaderAtomicOpCase).m_initialValue)) {
            local_1b0._0_8_ =
                 ((local_238->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode
                 .m_testCtx)->m_log;
            this_00 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(this_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,"ERROR: at group ",0x10);
            std::ostream::operator<<(this_00,(int)local_228);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,", invocation ",0xd);
            std::ostream::operator<<(this_00,iVar16);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,": expected value in range [",0x1b);
            std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
            std::ostream::operator<<(this_00,iVar15);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"], got ",7);
            std::ostream::operator<<(this_00,local_240);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(this_00);
            std::ios_base::~ios_base(local_138);
            bVar3 = false;
          }
          else {
            for (; (_Rb_tree_header *)p_Var11 != (_Rb_tree_header *)0x0;
                p_Var11 = (&p_Var11->_M_left)[(int)*(size_t *)(p_Var11 + 1) < local_240]) {
              if (local_240 <= (int)*(size_t *)(p_Var11 + 1)) {
                p_Var8 = p_Var11;
              }
            }
            p_Var10 = p_Var18;
            if (((_Rb_tree_header *)p_Var8 != p_Var18) &&
               (p_Var10 = (_Rb_tree_header *)p_Var8,
               local_240 < (int)((_Rb_tree_header *)p_Var8)->_M_node_count)) {
              p_Var10 = p_Var18;
            }
            if (p_Var10 == p_Var18) {
              std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
              _M_insert_unique<int_const&>
                        ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *
                         )&local_200,&local_240);
              local_23c = local_23c & 0xff;
              if (local_240 == iVar15) {
                local_23c = 1;
              }
              bVar3 = true;
            }
            else {
              local_1b0._0_8_ =
                   ((local_238->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.
                    super_TestNode.m_testCtx)->m_log;
              std::__cxx11::ostringstream::ostringstream(poVar1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,"ERROR: at group ",0x10);
              std::ostream::operator<<(poVar1,(int)local_228);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,", invocation ",0xd);
              std::ostream::operator<<(poVar1,iVar16);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,": found duplicate value ",0x18);
              std::ostream::operator<<(poVar1,local_240);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(poVar1);
              std::ios_base::~ios_base(local_138);
              bVar3 = false;
            }
          }
          uVar4 = local_23c;
          if (!bVar3) break;
          uVar17 = uVar17 + 1;
          bVar6 = (long)uVar17 < local_1c8;
        } while (uVar17 != local_210);
      }
      uVar17 = local_228;
      this = local_238;
      p_Var8 = &local_200._M_impl.super__Rb_tree_header._M_header;
      if (bVar6) {
LAB_0149946e:
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree(&local_200);
        local_1d0 = extraout_RAX;
        break;
      }
      if ((uVar4 & 1) == 0) {
        local_1b0._0_8_ =
             ((local_238->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        uVar17 = local_228;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"ERROR: could not find maximum expected value from group ",0x38
                  );
        std::ostream::operator<<(poVar1,(int)uVar17);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_0149945c:
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
        std::ios_base::~ios_base(local_138);
        goto LAB_0149946e;
      }
      dVar2 = (local_238->super_ShaderAtomicOpCase).m_initialValue;
      if (local_200._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        p_Var8 = &local_200._M_impl.super__Rb_tree_header._M_header;
        p_Var11 = local_200._M_impl.super__Rb_tree_header._M_header._M_parent;
        do {
          if ((int)dVar2 <= (int)p_Var11[1]._M_color) {
            p_Var8 = p_Var11;
          }
          p_Var11 = (&p_Var11->_M_left)[(int)p_Var11[1]._M_color < (int)dVar2];
        } while (p_Var11 != (_Base_ptr)0x0);
      }
      p_Var18 = &local_200._M_impl.super__Rb_tree_header;
      p_Var11 = &p_Var18->_M_header;
      if (((_Rb_tree_header *)p_Var8 != p_Var18) &&
         (p_Var11 = p_Var8, (int)dVar2 < (int)p_Var8[1]._M_color)) {
        p_Var11 = &p_Var18->_M_header;
      }
      if ((_Rb_tree_header *)p_Var11 == p_Var18) {
        local_1b0._0_8_ =
             ((local_238->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"ERROR: could not find initial value from group ",0x2f);
        std::ostream::operator<<(poVar1,(int)uVar17);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_0149945c;
      }
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&local_200);
      uVar17 = uVar17 + 1;
      local_242 = local_1d0 <= uVar17;
      local_218 = local_218 + local_21c;
    } while (uVar17 != local_1d0);
  }
  return (int)CONCAT71((int7)(local_1d0 >> 8),local_242);
}

Assistant:

bool verify (int numValues, int inputStride, const void* inputs, int outputStride, const void* outputs, int groupStride, const void* groupOutputs) const
	{
		const int	workGroupSize	= (int)product(m_workGroupSize);
		const int	numWorkGroups	= numValues/workGroupSize;

		for (int groupNdx = 0; groupNdx < numWorkGroups; groupNdx++)
		{
			const int	groupOffset		= groupNdx*workGroupSize;
			const int	groupOutput		= *(const deInt32*)((const deUint8*)groupOutputs + groupNdx*groupStride);
			set<int>	outValues;
			bool		maxFound		= false;
			int			valueSum		= (int)m_initialValue;

			for (int localNdx = 0; localNdx < workGroupSize; localNdx++)
			{
				const int inputValue = *(const deInt32*)((const deUint8*)inputs + inputStride*(groupOffset+localNdx));
				valueSum += inputValue;
			}

			if (groupOutput != valueSum)
			{
				m_testCtx.getLog() << TestLog::Message << "ERROR: at group " << groupNdx << ": expected sum " << valueSum << ", got " << groupOutput << TestLog::EndMessage;
				return false;
			}

			for (int localNdx = 0; localNdx < workGroupSize; localNdx++)
			{
				const int	inputValue		= *(const deInt32*)((const deUint8*)inputs + inputStride*(groupOffset+localNdx));
				const int	outputValue		= *(const deInt32*)((const deUint8*)outputs + outputStride*(groupOffset+localNdx));

				if (!de::inRange(outputValue, (int)m_initialValue, valueSum-inputValue))
				{
					m_testCtx.getLog() << TestLog::Message << "ERROR: at group " << groupNdx << ", invocation " << localNdx
														   << ": expected value in range [" << m_initialValue << ", " << (valueSum-inputValue)
														   << "], got " << outputValue
									   << TestLog::EndMessage;
					return false;
				}

				if (outValues.find(outputValue) != outValues.end())
				{
					m_testCtx.getLog() << TestLog::Message << "ERROR: at group " << groupNdx << ", invocation " << localNdx
														   << ": found duplicate value " << outputValue
									   << TestLog::EndMessage;
					return false;
				}

				outValues.insert(outputValue);
				if (outputValue == valueSum-inputValue)
					maxFound = true;
			}

			if (!maxFound)
			{
				m_testCtx.getLog() << TestLog::Message << "ERROR: could not find maximum expected value from group " << groupNdx << TestLog::EndMessage;
				return false;
			}

			if (outValues.find((int)m_initialValue) == outValues.end())
			{
				m_testCtx.getLog() << TestLog::Message << "ERROR: could not find initial value from group " << groupNdx << TestLog::EndMessage;
				return false;
			}
		}

		return true;
	}